

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

void secp256k1_ellswift_elligatorswift_var
               (uchar *u32,secp256k1_fe *t,secp256k1_ge *p,secp256k1_sha256 *hasher)

{
  uint *puVar1;
  uint *puVar2;
  byte bVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  secp256k1_ge *psVar10;
  secp256k1_ecmult_gen_context *a;
  char cVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  secp256k1_fe *data;
  ulong uVar15;
  uchar *seckey;
  uint uVar16;
  ulong uVar17;
  secp256k1_ge *u32_00;
  secp256k1_ecmult_gen_context *ecmult_gen_ctx;
  ulong uVar18;
  ulong uVar19;
  secp256k1_fe *a_00;
  undefined1 auVar20 [16];
  secp256k1_fe u;
  uchar branch_hash [32];
  secp256k1_scalar sStack_200;
  secp256k1_ge sStack_1d8;
  secp256k1_sha256 sStack_170;
  secp256k1_fe sStack_108;
  ulong uStack_d8;
  secp256k1_ge *psStack_d0;
  ulong uStack_c8;
  secp256k1_fe *psStack_c0;
  secp256k1_ecmult_gen_context *psStack_b8;
  secp256k1_fe *psStack_b0;
  secp256k1_ge *local_a0;
  secp256k1_ecmult_gen_context *local_98;
  long local_90;
  secp256k1_fe local_88;
  byte local_58 [40];
  
  uVar19 = 0;
  local_90 = 0x1000003d1;
  uVar17 = 0;
  local_a0 = p;
  local_98 = (secp256k1_ecmult_gen_context *)t;
  do {
    iVar12 = (int)uVar17;
    if (iVar12 == 0) {
      psStack_b0 = (secp256k1_fe *)0x120591;
      secp256k1_ellswift_prng(local_58,hasher,(uint32_t)uVar19);
      iVar12 = 0x40;
      uVar19 = (ulong)((uint32_t)uVar19 + 1);
    }
    uVar16 = iVar12 - 1;
    uVar17 = (ulong)uVar16;
    bVar3 = local_58[uVar16 >> 1];
    a_00 = (secp256k1_fe *)(ulong)bVar3;
    psStack_b0 = (secp256k1_fe *)0x1205b3;
    secp256k1_ellswift_prng(u32,hasher,(uint32_t)uVar19);
    psStack_b0 = (secp256k1_fe *)0x1205be;
    secp256k1_fe_impl_set_b32_mod(&local_88,u32);
    local_88.magnitude = 1;
    local_88.normalized = 0;
    psStack_b0 = (secp256k1_fe *)0x1205cf;
    secp256k1_fe_verify(&local_88);
    psStack_b0 = (secp256k1_fe *)0x1205d7;
    secp256k1_fe_verify(&local_88);
    uVar13 = (local_88.n[4] >> 0x30) * local_90 + local_88.n[0];
    if (((uVar13 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar13 & 0xfffffffffffff) == 0)) {
      uVar15 = (uVar13 >> 0x34) + local_88.n[1];
      u32_00 = (secp256k1_ge *)((uVar15 >> 0x34) + local_88.n[2]);
      ecmult_gen_ctx = (secp256k1_ecmult_gen_context *)(((ulong)u32_00 >> 0x34) + local_88.n[3]);
      uVar18 = ((ulong)ecmult_gen_ctx >> 0x34) + (local_88.n[4] & 0xffffffffffff);
      data = (secp256k1_fe *)
             ((uVar15 | uVar13 | (ulong)u32_00 | (ulong)ecmult_gen_ctx) & 0xfffffffffffff | uVar18);
      if ((data == (secp256k1_fe *)0x0) ||
         (data = (secp256k1_fe *)0x1000003d0,
         ((uVar13 | 0x1000003d0) & uVar15 & (ulong)u32_00 & (ulong)ecmult_gen_ctx &
         (uVar18 ^ 0xf000000000000)) == 0xfffffffffffff)) {
        psStack_b0 = (secp256k1_fe *)0x1207a1;
        secp256k1_ellswift_elligatorswift_var_cold_1();
        goto LAB_001207a1;
      }
    }
    uVar19 = (ulong)((uint32_t)uVar19 + 1);
    uVar16 = bVar3 >> ((char)uVar16 * '\x04' & 4U) & 7;
    a_00 = (secp256k1_fe *)(ulong)uVar16;
    psStack_b0 = (secp256k1_fe *)0x1206c1;
    data = a_00;
    u32_00 = local_a0;
    iVar12 = secp256k1_ellswift_xswiftec_inv_var
                       ((secp256k1_fe *)local_98,&local_a0->x,&local_88,uVar16);
    a = local_98;
    if (iVar12 != 0) {
      psStack_b0 = (secp256k1_fe *)0x1206d6;
      secp256k1_fe_normalize_var((secp256k1_fe *)local_98);
      psStack_b0 = (secp256k1_fe *)0x1206de;
      ecmult_gen_ctx = a;
      secp256k1_fe_verify((secp256k1_fe *)a);
      psVar10 = local_a0;
      hasher = (secp256k1_sha256 *)a;
      if (*(int *)((long)(a->ge_offset).x.n + 4) == 0) {
LAB_001207a1:
        psStack_b0 = (secp256k1_fe *)0x1207a6;
        secp256k1_ellswift_elligatorswift_var_cold_3();
      }
      else {
        uVar17 = *(ulong *)a;
        a_00 = &local_a0->y;
        psStack_b0 = (secp256k1_fe *)0x1206fe;
        ecmult_gen_ctx = (secp256k1_ecmult_gen_context *)a_00;
        secp256k1_fe_verify(a_00);
        u32 = (uchar *)psVar10;
        if ((psVar10->y).normalized != 0) {
          if ((((uint)uVar17 ^ (uint)a_00->n[0]) & 1) == 0) {
            return;
          }
          psStack_b0 = (secp256k1_fe *)0x120729;
          secp256k1_fe_verify((secp256k1_fe *)a);
          psStack_b0 = (secp256k1_fe *)0x120736;
          secp256k1_fe_verify_magnitude((secp256k1_fe *)a,1);
          uVar4 = (a->scalar_offset).d[0];
          uVar5 = (a->scalar_offset).d[1];
          uVar6 = (a->scalar_offset).d[2];
          *(long *)a = 0x3ffffbfffff0bc - *(long *)a;
          (a->scalar_offset).d[0] = 0x3ffffffffffffc - uVar4;
          (a->scalar_offset).d[1] = 0x3ffffffffffffc - uVar5;
          (a->scalar_offset).d[2] = 0x3ffffffffffffc - uVar6;
          (a->scalar_offset).d[3] = 0x3fffffffffffc - (a->scalar_offset).d[3];
          (a->ge_offset).x.n[0] = 2;
          psStack_b0 = (secp256k1_fe *)0x120786;
          secp256k1_fe_verify((secp256k1_fe *)a);
          secp256k1_fe_normalize_var((secp256k1_fe *)a);
          return;
        }
      }
      psStack_b0 = (secp256k1_fe *)secp256k1_ellswift_create;
      secp256k1_ellswift_elligatorswift_var_cold_2();
      uStack_d8 = uVar17;
      psStack_d0 = (secp256k1_ge *)u32;
      uStack_c8 = uVar19;
      psStack_c0 = a_00;
      psStack_b8 = (secp256k1_ecmult_gen_context *)hasher;
      psStack_b0 = &local_88;
      if (ecmult_gen_ctx == (secp256k1_ecmult_gen_context *)0x0) {
        secp256k1_ellswift_create_cold_6();
      }
      else if (u32_00 != (secp256k1_ge *)0x0) {
        (u32_00->y).n[0] = 0;
        (u32_00->y).n[1] = 0;
        *(undefined1 (*) [16])((u32_00->x).n + 4) = (undefined1  [16])0x0;
        (u32_00->x).n[2] = 0;
        (u32_00->x).n[3] = 0;
        (u32_00->x).n[0] = 0;
        (u32_00->x).n[1] = 0;
        if (ecmult_gen_ctx->built == 0) {
          secp256k1_ellswift_create_cold_4();
          return;
        }
        if (seckey == (uchar *)0x0) {
          secp256k1_ellswift_create_cold_3();
          return;
        }
        iVar12 = secp256k1_ec_pubkey_create_helper(ecmult_gen_ctx,&sStack_200,&sStack_1d8,seckey);
        if ((int)ecmult_gen_ctx[1].scalar_offset.d[3] != 0) {
          secp256k1_ellswift_create_cold_1();
        }
        secp256k1_fe_normalize_var(&sStack_1d8.x);
        secp256k1_fe_normalize_var(&sStack_1d8.y);
        sStack_170.s[0] = 0xd29e1bf5;
        sStack_170.s[1] = 0xf7025f42;
        sStack_170.s[2] = 0x9b024773;
        sStack_170.s[3] = 0x94cb7d5;
        sStack_170.s[4] = 0xe59ed789;
        sStack_170.s[5] = 0x3bc9786;
        sStack_170.s[6] = 0x68335b35;
        sStack_170.s[7] = 0x4e363b53;
        sStack_170.bytes = 0x40;
        secp256k1_sha256_write(&sStack_170,seckey,0x20);
        secp256k1_sha256_write(&sStack_170,"",0x20);
        if ((int)ecmult_gen_ctx[1].scalar_offset.d[3] != 0) {
          secp256k1_ellswift_create_cold_2();
        }
        if (data != (secp256k1_fe *)0x0) {
          secp256k1_sha256_write(&sStack_170,(uchar *)data,0x20);
        }
        secp256k1_ellswift_elligatorswift_var((uchar *)u32_00,&sStack_108,&sStack_1d8,&sStack_170);
        secp256k1_fe_get_b32((uchar *)((u32_00->x).n + 4),&sStack_108);
        cVar11 = ((byte)iVar12 ^ 1) - 1;
        auVar20 = ZEXT216(CONCAT11(cVar11,cVar11));
        auVar20 = pshuflw(auVar20,auVar20,0);
        uVar16 = auVar20._0_4_;
        lVar14 = 0;
        do {
          puVar1 = (uint *)((long)(u32_00->x).n + lVar14);
          uVar7 = puVar1[1];
          uVar8 = puVar1[2];
          uVar9 = puVar1[3];
          puVar2 = (uint *)((long)(u32_00->x).n + lVar14);
          *puVar2 = *puVar1 & uVar16;
          puVar2[1] = uVar7 & uVar16;
          puVar2[2] = uVar8 & uVar16;
          puVar2[3] = uVar9 & uVar16;
          lVar14 = lVar14 + 0x10;
        } while (lVar14 != 0x40);
        return;
      }
      secp256k1_ellswift_create_cold_5();
      return;
    }
  } while( true );
}

Assistant:

static void secp256k1_ellswift_elligatorswift_var(unsigned char *u32, secp256k1_fe *t, const secp256k1_ge *p, const secp256k1_sha256 *hasher) {
    secp256k1_ellswift_xelligatorswift_var(u32, t, &p->x, hasher);
    secp256k1_fe_normalize_var(t);
    if (secp256k1_fe_is_odd(t) != secp256k1_fe_is_odd(&p->y)) {
        secp256k1_fe_negate(t, t, 1);
        secp256k1_fe_normalize_var(t);
    }
}